

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_neg_tet_geom_support(REF_SUBDIV ref_subdiv,REF_BOOL *again)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_INT *pRVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  REF_INT RVar9;
  uint uVar10;
  REF_INT RVar11;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT nst_5;
  REF_INT nst_4;
  REF_INT nst_3;
  REF_INT nst_2;
  REF_INT nst_1;
  REF_INT nst;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL unmark_cell;
  REF_DBL volume;
  REF_INT local_150;
  REF_INT e5;
  REF_INT e4;
  REF_INT e3;
  REF_INT e2;
  REF_INT e1;
  REF_INT e0;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT global_edge;
  REF_INT split_edge;
  REF_INT edge;
  REF_INT node;
  REF_INT map;
  REF_INT new_nodes [27];
  REF_INT local_a4;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *again_local;
  REF_SUBDIV ref_subdiv_local;
  
  ref_node_00 = ref_subdiv->grid->node;
  ref_cell_00 = ref_subdiv->grid->cell[8];
  local_34 = 0;
  do {
    RVar11 = local_a4;
    if (ref_cell_00->max <= local_34) {
      return 0;
    }
    if (((-1 < local_34) && (local_34 < ref_cell_00->max)) &&
       (ref_cell_00->c2n[ref_cell_00->size_per * local_34] != -1)) {
      bVar2 = false;
      edge = ref_subdiv_map(ref_subdiv,ref_cell_00,local_34);
      uVar10 = ref_cell_nodes(ref_cell_00,local_34,new_nodes + 0x1a);
      RVar9 = new_nodes[0x1a];
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x277,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"nodes");
        return uVar10;
      }
      switch(edge) {
      case 0:
        break;
      case 1:
      case 2:
      case 4:
      case 8:
      case 0x10:
      case 0x20:
        n0 = -1;
        for (global_edge = 0; global_edge < ref_cell_00->edge_per; global_edge = global_edge + 1) {
          pRVar1 = ref_subdiv->mark;
          RVar11 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,global_edge,local_34);
          if (pRVar1[RVar11] != 0) {
            n0 = global_edge;
          }
        }
        if (n0 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x286,"ref_subdiv_unmark_neg_tet_geom_support","edge not found");
          return 1;
        }
        n1 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,n0,local_34);
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        (&node)[ref_cell_00->e2n[n0 << 1]] = ref_subdiv->node[n1];
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x28c,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        (&node)[ref_cell_00->e2n[n0 * 2 + 1]] = ref_subdiv->node[n1];
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x292,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume || bVar2;
        break;
      case 0xb:
      case 0x15:
      case 0x26:
      case 0x38:
        if (edge == 0x38) {
          new_nodes[0x1a] = nodes[1];
          nodes[1] = RVar9;
          local_a4 = nodes[0];
          nodes[0] = RVar11;
        }
        RVar9 = local_a4;
        RVar11 = new_nodes[0x1a];
        if (edge == 0x26) {
          local_a4 = nodes[1];
          nodes[1] = RVar9;
          new_nodes[0x1a] = nodes[0];
          nodes[0] = RVar11;
        }
        RVar9 = nodes[0];
        RVar11 = new_nodes[0x1a];
        if (edge == 0x15) {
          nodes[0] = nodes[1];
          nodes[1] = RVar9;
          new_nodes[0x1a] = local_a4;
          local_a4 = RVar11;
        }
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],local_a4,&map);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2ac,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],nodes[0],new_nodes);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2af,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2b0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,local_a4,new_nodes[0x1a],&node);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2b7,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,local_a4,nodes[0],new_nodes);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2ba,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 699,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar3 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,nodes[0],new_nodes[0x1a],&node);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2c2,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,nodes[0],local_a4,&map);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2c5,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2c6,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar4 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        for (split_edge = 0; split_edge < 4; split_edge = split_edge + 1) {
          (&node)[split_edge] = new_nodes[(long)split_edge + 0x1a];
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],local_a4,&node);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2cd,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,local_a4,nodes[0],&map);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2d0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,nodes[0],new_nodes[0x1a],new_nodes);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2d3,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"mis");
          return uVar10;
        }
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2d4,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume || (bVar4 || (bVar3 || bVar2))
        ;
        break;
      case 0x3f:
        n2 = new_nodes[0x1a];
        n3 = local_a4;
        e0 = nodes[0];
        e1 = nodes[1];
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],local_a4,&e2);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2dd,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],nodes[0],&e3);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2de,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,new_nodes[0x1a],nodes[1],&e4);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2df,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,local_a4,nodes[0],&e5);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2e0,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between(ref_subdiv,local_a4,nodes[1],&local_150);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2e1,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        uVar10 = ref_subdiv_node_between
                           (ref_subdiv,nodes[0],nodes[1],(REF_INT *)((long)&volume + 4));
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2e2,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"e");
          return uVar10;
        }
        node = e2;
        map = e4;
        new_nodes[0] = e3;
        new_nodes[1] = n2;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2e7,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e2;
        map = e5;
        new_nodes[0] = local_150;
        new_nodes[1] = n3;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2ee,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar3 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e3;
        map = volume._4_4_;
        new_nodes[0] = e5;
        new_nodes[1] = e0;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2f5,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar4 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e4;
        map = local_150;
        new_nodes[0] = volume._4_4_;
        new_nodes[1] = e1;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2fc,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar5 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e2;
        map = volume._4_4_;
        new_nodes[0] = e3;
        new_nodes[1] = e4;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x303,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar6 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e2;
        map = volume._4_4_;
        new_nodes[0] = e4;
        new_nodes[1] = local_150;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x30a,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar7 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e2;
        map = volume._4_4_;
        new_nodes[0] = local_150;
        new_nodes[1] = e5;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x311,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar8 = _ref_private_macro_code_rss < ref_node_00->min_volume;
        node = e2;
        map = volume._4_4_;
        new_nodes[0] = e5;
        new_nodes[1] = e3;
        uVar10 = ref_node_tet_vol(ref_node_00,&node,(REF_DBL *)&ref_private_macro_code_rss);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x318,"ref_subdiv_unmark_neg_tet_geom_support",(ulong)uVar10,"split vol");
          return uVar10;
        }
        bVar2 = _ref_private_macro_code_rss < ref_node_00->min_volume ||
                (bVar8 || (bVar7 || (bVar6 || (bVar5 || (bVar4 || (bVar3 || bVar2))))));
      }
      if (bVar2) {
        *again = 1;
        for (global_edge = 0; global_edge < ref_cell_00->edge_per; global_edge = global_edge + 1) {
          pRVar1 = ref_subdiv->mark;
          RVar11 = ref_subdiv_c2e(ref_subdiv,ref_cell_00,global_edge,local_34);
          pRVar1[RVar11] = 0;
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_neg_tet_geom_support(
    REF_SUBDIV ref_subdiv, REF_BOOL *again) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT map;
  REF_INT node;
  REF_INT edge, split_edge, global_edge;
  REF_INT n0, n1, n2, n3;
  REF_INT e0, e1, e2, e3, e4, e5;
  REF_DBL volume;
  REF_BOOL unmark_cell;

  each_ref_cell_valid_cell(ref_cell, cell) {
    unmark_cell = REF_FALSE;
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
        split_edge = REF_EMPTY;
        for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++)
          if (ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)))
            split_edge = edge;
        RAS(REF_EMPTY != split_edge, "edge not found");
        global_edge = ref_subdiv_c2e(ref_subdiv, ref_cell, split_edge, cell);

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 0, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 1, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        break;
      case 11:
      case 56:
      case 38:
      case 21:
        /* orient cell for other cases */
        if (56 == map) {
          node_swap(nodes, 0, 3);
          node_swap(nodes, 1, 2);
        }
        if (38 == map) {
          node_swap(nodes, 1, 3);
          node_swap(nodes, 0, 2);
        }
        if (21 == map) {
          node_swap(nodes, 2, 3);
          node_swap(nodes, 0, 1);
        }

        /* near node 0 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        /* near node 1 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        /* near node 2 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        /* center */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        break;
      case 63:
        n0 = nodes[0];
        n1 = nodes[1];
        n2 = nodes[2];
        n3 = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1], &e0), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2], &e1), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3], &e2), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2], &e3), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[3], &e4), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3], &e5), "e");
        new_nodes[0] = e0;
        new_nodes[1] = e2;
        new_nodes[2] = e1;
        new_nodes[3] = n0;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e0;
        new_nodes[1] = e3;
        new_nodes[2] = e4;
        new_nodes[3] = n1;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e1;
        new_nodes[1] = e5;
        new_nodes[2] = e3;
        new_nodes[3] = n2;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e2;
        new_nodes[1] = e4;
        new_nodes[2] = e5;
        new_nodes[3] = n3;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e0;
        new_nodes[1] = e5;
        new_nodes[2] = e1;
        new_nodes[3] = e2;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e0;
        new_nodes[1] = e5;
        new_nodes[2] = e2;
        new_nodes[3] = e4;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e0;
        new_nodes[1] = e5;
        new_nodes[2] = e4;
        new_nodes[3] = e3;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        new_nodes[0] = e0;
        new_nodes[1] = e5;
        new_nodes[2] = e3;
        new_nodes[3] = e1;
        RSS(ref_node_tet_vol(ref_node, new_nodes, &volume), "split vol");
        if (ref_node_min_volume(ref_node) > volume) unmark_cell = REF_TRUE;

        break;
    }
    if (unmark_cell) {
      *again = REF_TRUE;
      for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
        ref_subdiv_mark(ref_subdiv,
                        ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)) = 0;
      }
    }
  }
  return REF_SUCCESS;
}